

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

string * __thiscall
t_go_generator::type_to_go_type_with_opt_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *type,bool optional_field)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  undefined8 *puVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  string *psVar4;
  t_set *t;
  allocator local_101;
  string keyType;
  string valueType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string maybe_pointer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar3 = "*";
  if ((int)CONCAT71(in_register_00000009,optional_field) == 0) {
    pcVar3 = "";
  }
  std::__cxx11::string::string((string *)&maybe_pointer,pcVar3,(allocator *)&keyType);
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
  if (((char)iVar1 != '\0') && (type[1].super_t_doc.has_doc_ == true)) {
    type = t_type::get_true_type(type);
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[5])(type);
  if ((char)iVar1 != '\0') {
    switch(*(undefined4 *)&type[1].super_t_doc._vptr_t_doc) {
    case 0:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    case 1:
      iVar1 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
      pcVar3 = "string";
      if ((char)iVar1 != '\0') {
        pcVar3 = "[]byte";
      }
      break;
    case 2:
      pcVar3 = "bool";
      break;
    case 3:
      pcVar3 = "int8";
      break;
    case 4:
      pcVar3 = "int16";
      break;
    case 5:
      pcVar3 = "int32";
      break;
    case 6:
      pcVar3 = "int64";
      break;
    case 7:
      pcVar3 = "float64";
      break;
    default:
switchD_001c23a6_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_go_type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    std::operator+(__return_storage_ptr__,&maybe_pointer,pcVar3);
    goto LAB_001c24bc;
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[10])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
    if (((char)iVar1 != '\0') ||
       (iVar1 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type), (char)iVar1 != '\0')) {
      type_name_abi_cxx11_(&valueType,this,type);
      publicize(&keyType,this,&valueType,false);
      std::operator+(__return_storage_ptr__,"*",&keyType);
      goto LAB_001c2465;
    }
    iVar1 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
          if ((char)iVar1 == '\0') goto switchD_001c23a6_default;
          type_name_abi_cxx11_(&valueType,this,type);
          publicize(&keyType,this,&valueType,false);
          std::operator+(__return_storage_ptr__,&maybe_pointer,&keyType);
          goto LAB_001c2465;
        }
        type_to_go_type_abi_cxx11_(&keyType,this,*(t_type **)&type[1].super_t_doc.has_doc_);
        std::__cxx11::string::string((string *)&local_c0,"[]",(allocator *)&local_80);
        std::operator+(&valueType,&maybe_pointer,&local_c0);
        std::operator+(__return_storage_ptr__,&valueType,&keyType);
      }
      else {
        type_to_go_type_abi_cxx11_(&keyType,this,*(t_type **)&type[1].super_t_doc.has_doc_);
        std::__cxx11::string::string((string *)&local_c0,"[]",(allocator *)&local_80);
        std::operator+(&valueType,&maybe_pointer,&local_c0);
        std::operator+(__return_storage_ptr__,&valueType,&keyType);
      }
      std::__cxx11::string::~string((string *)&valueType);
      psVar4 = &local_c0;
    }
    else {
      type_to_go_key_type_abi_cxx11_(&keyType,this,*(t_type **)&type[1].super_t_doc.has_doc_);
      type_to_go_type_abi_cxx11_(&valueType,this,*(t_type **)&type[1].annotations_._M_t._M_impl);
      std::__cxx11::string::string((string *)&local_60,"map[",&local_101);
      std::operator+(&local_40,&maybe_pointer,&local_60);
      std::operator+(&local_80,&local_40,&keyType);
      std::operator+(&local_c0,&local_80,"]");
      std::operator+(__return_storage_ptr__,&local_c0,&valueType);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      psVar4 = &valueType;
    }
    std::__cxx11::string::~string((string *)psVar4);
    psVar4 = &keyType;
  }
  else {
    type_name_abi_cxx11_(&valueType,this,type);
    publicize(&keyType,this,&valueType,false);
    std::operator+(__return_storage_ptr__,&maybe_pointer,&keyType);
LAB_001c2465:
    std::__cxx11::string::~string((string *)&keyType);
    psVar4 = &valueType;
  }
  std::__cxx11::string::~string((string *)psVar4);
LAB_001c24bc:
  std::__cxx11::string::~string((string *)&maybe_pointer);
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::type_to_go_type_with_opt(t_type* type,
                                                bool optional_field) {
  string maybe_pointer(optional_field ? "*" : "");

  if (type->is_typedef() && ((t_typedef*)type)->is_forward_typedef()) {
    type = ((t_typedef*)type)->get_true_type();
  }

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();

    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "";

    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        return maybe_pointer + "[]byte";
      }

      return maybe_pointer + "string";

    case t_base_type::TYPE_BOOL:
      return maybe_pointer + "bool";

    case t_base_type::TYPE_I8:
      return maybe_pointer + "int8";

    case t_base_type::TYPE_I16:
      return maybe_pointer + "int16";

    case t_base_type::TYPE_I32:
      return maybe_pointer + "int32";

    case t_base_type::TYPE_I64:
      return maybe_pointer + "int64";

    case t_base_type::TYPE_DOUBLE:
      return maybe_pointer + "float64";
    }
  } else if (type->is_enum()) {
    return maybe_pointer + publicize(type_name(type));
  } else if (type->is_struct() || type->is_xception()) {
    return "*" + publicize(type_name(type));
  } else if (type->is_map()) {
    t_map* t = (t_map*)type;
    string keyType = type_to_go_key_type(t->get_key_type());
    string valueType = type_to_go_type(t->get_val_type());
    return maybe_pointer + string("map[") + keyType + "]" + valueType;
  } else if (type->is_set()) {
    t_set* t = (t_set*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_list()) {
    t_list* t = (t_list*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_typedef()) {
    return maybe_pointer + publicize(type_name(type));
  }

  throw "INVALID TYPE IN type_to_go_type: " + type->get_name();
}